

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.cc
# Opt level: O2

Flags * __thiscall
flow::util::Flags::defineBool
          (Flags *this,string *longOpt,char shortOpt,string *helpText,
          function<void_(bool)> *callback)

{
  allocator<char> local_b9;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_90;
  long local_80;
  undefined8 uStack_78;
  string local_70;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"<bool>",&local_b9);
  local_50._M_engaged = false;
  std::function<void_(bool)>::function((function<void_(bool)> *)&local_90,callback);
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_b8._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_b8._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_b8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_b8._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_b8._M_unused._0_8_ + 0x18) = uStack_78;
  if (local_80 != 0) {
    *(void **)local_b8._M_unused._0_8_ = local_90._M_unused._M_object;
    *(undefined8 *)((long)local_b8._M_unused._0_8_ + 8) = local_90._8_8_;
    *(long *)((long)local_b8._M_unused._0_8_ + 0x10) = local_80;
    local_80 = 0;
    uStack_78 = 0;
  }
  pcStack_a0 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/util/Flags.cc:234:7)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/util/Flags.cc:234:7)>
             ::_M_manager;
  define(this,longOpt,shortOpt,false,Bool,&local_70,helpText,
         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_50,
         (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_90);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return this;
}

Assistant:

Flags& Flags::defineBool(
    const std::string& longOpt,
    char shortOpt,
    const std::string& helpText,
    std::function<void(bool)> callback) {

  return define(
      longOpt, shortOpt, false, FlagType::Bool, "<bool>",
      helpText, std::nullopt,
      [=](const std::string& value) {
        if (callback) {
          callback(value == "true");
        }
      });
}